

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O3

int4 __thiscall ActionReturnRecovery::apply(ActionReturnRecovery *this,Funcdata *data)

{
  int4 *piVar1;
  PcodeOpBank *this_00;
  int4 maxlevel;
  int iVar2;
  ParamActive *active;
  PcodeOp *op;
  Varnode *invn;
  ParamList *pPVar3;
  bool bVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  pointer pPVar7;
  long lVar8;
  ParamTrial *t;
  pointer pPVar9;
  long lVar10;
  AncestorRealistic ancestorReal;
  AncestorRealistic local_70;
  
  active = data->activeoutput;
  if (active == (ParamActive *)0x0) {
    return 0;
  }
  maxlevel = data->glb->trim_recurse_max;
  this_00 = &data->obank;
  cVar5 = PcodeOpBank::end(this_00,CPUI_RETURN);
  local_70.markedVn.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.markedVn.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.stateStack.
  super__Vector_base<AncestorRealistic::State,_std::allocator<AncestorRealistic::State>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.markedVn.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.stateStack.
  super__Vector_base<AncestorRealistic::State,_std::allocator<AncestorRealistic::State>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.stateStack.
  super__Vector_base<AncestorRealistic::State,_std::allocator<AncestorRealistic::State>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (cVar6 = PcodeOpBank::begin(this_00,CPUI_RETURN); cVar6._M_node != cVar5._M_node;
      cVar6._M_node = (cVar6._M_node)->_M_next) {
    op = (PcodeOp *)cVar6._M_node[1]._M_next;
    if ((op->flags & 0x3e00020) == 0) {
      pPVar9 = (active->trial).super__Vector_base<ParamTrial,_std::allocator<ParamTrial>_>._M_impl.
               super__Vector_impl_data._M_start;
      pPVar7 = (active->trial).super__Vector_base<ParamTrial,_std::allocator<ParamTrial>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (0 < (int)((ulong)((long)pPVar7 - (long)pPVar9) >> 4) * -0x55555555) {
        lVar8 = 0;
        lVar10 = 0;
        do {
          if ((*(byte *)((long)&pPVar9->flags + lVar8) & 1) == 0) {
            iVar2 = *(int *)((long)&pPVar9->slot + lVar8);
            t = (ParamTrial *)((long)&pPVar9->flags + lVar8);
            invn = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar2];
            bVar4 = AncestorRealistic::execute(&local_70,op,iVar2,t,false);
            if ((bVar4) && (bVar4 = Funcdata::ancestorOpUse(data,maxlevel,invn,op,t), bVar4)) {
              *(byte *)&t->flags = (byte)t->flags | 9;
            }
            piVar1 = &(this->super_Action).count;
            *piVar1 = *piVar1 + 1;
            pPVar9 = (active->trial).super__Vector_base<ParamTrial,_std::allocator<ParamTrial>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pPVar7 = (active->trial).super__Vector_base<ParamTrial,_std::allocator<ParamTrial>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          }
          lVar10 = lVar10 + 1;
          lVar8 = lVar8 + 0x30;
        } while (lVar10 < (int)((ulong)((long)pPVar7 - (long)pPVar9) >> 4) * -0x55555555);
      }
    }
  }
  iVar2 = active->numpasses;
  active->numpasses = iVar2 + 1;
  if (iVar2 < active->maxpass) {
    if ((active->isfullychecked & 1U) == 0) goto LAB_002e31c8;
  }
  else {
    active->isfullychecked = true;
  }
  pPVar3 = ((data->funcp).model)->output;
  (*pPVar3->_vptr_ParamList[4])(pPVar3,active);
  cVar5 = PcodeOpBank::end(this_00,CPUI_RETURN);
  for (cVar6 = PcodeOpBank::begin(this_00,CPUI_RETURN); cVar6._M_node != cVar5._M_node;
      cVar6._M_node = (cVar6._M_node)->_M_next) {
    if ((((PcodeOp *)cVar6._M_node[1]._M_next)->flags & 0x3e00020) == 0) {
      buildReturnOutput(active,(PcodeOp *)cVar6._M_node[1]._M_next,data);
    }
  }
  Funcdata::clearActiveOutput(data);
  piVar1 = &(this->super_Action).count;
  *piVar1 = *piVar1 + 1;
LAB_002e31c8:
  if (local_70.markedVn.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.markedVn.
                    super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_70.stateStack.
      super__Vector_base<AncestorRealistic::State,_std::allocator<AncestorRealistic::State>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.stateStack.
                    super__Vector_base<AncestorRealistic::State,_std::allocator<AncestorRealistic::State>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int4 ActionReturnRecovery::apply(Funcdata &data)

{
  ParamActive *active = data.getActiveOutput();
  if (active != (ParamActive *)0) {
    PcodeOp *op;
    Varnode *vn;
    list<PcodeOp *>::const_iterator iter,iterend;
    int4 i;
    
    int4 maxancestor = data.getArch()->trim_recurse_max;
    iterend = data.endOp(CPUI_RETURN);
    AncestorRealistic ancestorReal;
    for(iter=data.beginOp(CPUI_RETURN);iter!=iterend;++iter) {
      op = *iter;
      if (op->isDead()) continue;
      if (op->getHaltType() != 0) continue; // Don't evaluate special halts
      for(i=0;i<active->getNumTrials();++i) {
	ParamTrial &trial(active->getTrial(i));
	if (trial.isChecked()) continue; // Already checked
	int4 slot = trial.getSlot();
	vn = op->getIn(slot);
	if (ancestorReal.execute(op,slot,&trial,false))
	  if (data.ancestorOpUse(maxancestor,vn,op,trial))
	    trial.markActive(); // This varnode sees active use as a parameter
	count += 1;
      }
    }

    active->finishPass();
    if (active->getNumPasses() > active->getMaxPass())
      active->markFullyChecked();
    
    if (active->isFullyChecked()) {
      data.getFuncProto().deriveOutputMap(active);
      iterend = data.endOp(CPUI_RETURN);
      for(iter=data.beginOp(CPUI_RETURN);iter!=iterend;++iter) {
	op = *iter;
	if (op->isDead()) continue;
	if (op->getHaltType() != 0) continue;
	buildReturnOutput(active,op,data);
      }
      data.clearActiveOutput();
      count += 1;
    }
  }
  return 0;
}